

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void av1_dr_prediction_z3_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  uint8_t uVar1;
  undefined8 uVar2;
  __m128i alVar3;
  ushort uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint8_t *puVar13;
  undefined1 (*pauVar14) [16];
  byte bVar15;
  long lVar16;
  long lVar17;
  ptrdiff_t pitchSrc;
  int iVar18;
  int i;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i alVar40;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  __m128i alVar41;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  __m128i alVar56;
  __m128i alVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  __m128i dstvec_2 [4];
  __m256i dstvec [32];
  __m128i local_1460;
  __m128i alStack_1450;
  __m128i local_1440;
  __m128i alStack_1430;
  __m128i local_1420;
  __m128i local_1410;
  __m128i local_1400;
  __m128i local_13f0;
  longlong alStack_13e0 [48];
  longlong alStack_1260 [64];
  __m128i local_1060;
  __m128i local_1050;
  __m128i local_1040;
  __m128i local_1030;
  __m128i local_1020;
  __m128i local_1010;
  __m128i local_1000;
  __m128i local_ff0;
  __m128i local_fe0;
  __m128i local_fd0;
  __m128i local_fc0;
  __m128i local_fb0;
  __m128i local_fa0;
  __m128i local_f90;
  __m128i local_f80;
  __m128i local_f70;
  longlong local_f60 [486];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  
  iVar18 = (int)left;
  bVar15 = (byte)upsample_left;
  if (bw != bh) {
    if (bw < bh) {
      if (bw * 2 == bh) {
        switch(bw << 0x1e | bw - 4U >> 2) {
        case 0:
          iVar18 = 0xb << (bVar15 & 0x1f);
          uVar1 = left[iVar18];
          auVar25[1] = uVar1;
          auVar25[0] = uVar1;
          auVar25[2] = uVar1;
          auVar25[3] = uVar1;
          auVar25[4] = uVar1;
          auVar25[5] = uVar1;
          auVar25[6] = uVar1;
          auVar25[7] = uVar1;
          auVar25[8] = uVar1;
          auVar25[9] = uVar1;
          auVar25[10] = uVar1;
          auVar25[0xb] = uVar1;
          auVar25[0xc] = uVar1;
          auVar25[0xd] = uVar1;
          auVar25[0xe] = uVar1;
          auVar25[0xf] = uVar1;
          auVar43._8_2_ = 0x10;
          auVar43._0_8_ = 0x10001000100010;
          auVar43._10_2_ = 0x10;
          auVar43._12_2_ = 0x10;
          auVar43._14_2_ = 0x10;
          auVar43._16_2_ = 0x10;
          auVar43._18_2_ = 0x10;
          auVar43._20_2_ = 0x10;
          auVar43._22_2_ = 0x10;
          auVar43._24_2_ = 0x10;
          auVar43._26_2_ = 0x10;
          auVar43._28_2_ = 0x10;
          auVar43._30_2_ = 0x10;
          auVar62._8_2_ = 0x1f;
          auVar62._0_8_ = 0x1f001f001f001f;
          auVar62._10_2_ = 0x1f;
          auVar62._12_2_ = 0x1f;
          auVar62._14_2_ = 0x1f;
          auVar62._16_2_ = 0x1f;
          auVar62._18_2_ = 0x1f;
          auVar62._20_2_ = 0x1f;
          auVar62._22_2_ = 0x1f;
          auVar62._24_2_ = 0x1f;
          auVar62._26_2_ = 0x1f;
          auVar62._28_2_ = 0x1f;
          auVar62._30_2_ = 0x1f;
          uVar23 = dy;
          for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
            iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
            uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
            if ((int)uVar19 < 1) goto LAB_002fdb24;
            uVar20 = (ulong)uVar19;
            if (7 < uVar19) {
              uVar20 = 8;
            }
            auVar32 = *(undefined1 (*) [16])(left + iVar21);
            if (upsample_left == 0) {
              auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
              uVar4 = (ushort)(uVar23 >> 1);
              uVar78 = uVar4 & 0x1f;
              auVar83._0_8_ =
                   CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
              auVar83._8_2_ = uVar78;
              auVar83._10_2_ = uVar78;
              auVar83._12_2_ = uVar78;
              auVar83._14_2_ = uVar78;
              auVar83._16_2_ = uVar78;
              auVar83._18_2_ = uVar78;
              auVar83._20_2_ = uVar78;
              auVar83._22_2_ = uVar78;
              auVar83._24_2_ = uVar78;
              auVar83._26_2_ = uVar78;
              auVar83._28_2_ = uVar78;
              auVar83._30_2_ = uVar78;
            }
            else {
              auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
              auVar76 = vpsrldq_avx(auVar32,8);
              auVar82._0_2_ = (undefined2)uVar23;
              auVar82._2_2_ = auVar82._0_2_;
              auVar82._4_2_ = auVar82._0_2_;
              auVar82._6_2_ = auVar82._0_2_;
              auVar82._8_2_ = auVar82._0_2_;
              auVar82._10_2_ = auVar82._0_2_;
              auVar82._12_2_ = auVar82._0_2_;
              auVar82._14_2_ = auVar82._0_2_;
              auVar82._16_2_ = auVar82._0_2_;
              auVar82._18_2_ = auVar82._0_2_;
              auVar82._20_2_ = auVar82._0_2_;
              auVar82._22_2_ = auVar82._0_2_;
              auVar82._24_2_ = auVar82._0_2_;
              auVar82._26_2_ = auVar82._0_2_;
              auVar82._28_2_ = auVar82._0_2_;
              auVar82._30_2_ = auVar82._0_2_;
              auVar80 = vpsllw_avx2(auVar82,ZEXT416((uint)upsample_left));
              auVar80 = vpsrlw_avx2(auVar80,1);
              auVar83 = vpand_avx2(auVar80,auVar62);
            }
            auVar80 = vpmovzxbw_avx2(auVar32);
            auVar71 = vpmovzxbw_avx2(auVar76);
            auVar71 = vpsubw_avx2(auVar71,auVar80);
            auVar71 = vpmullw_avx2(auVar71,auVar83);
            auVar80 = vpsllw_avx2(auVar80,5);
            auVar80 = vpaddw_avx2(auVar80,auVar43);
            auVar80 = vpaddw_avx2(auVar71,auVar80);
            auVar80 = vpsrlw_avx2(auVar80,5);
            auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
            auVar32 = vpblendvb_avx(auVar25,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
            *(undefined1 (*) [16])((long)local_1460 + lVar16) = auVar32;
            uVar23 = uVar23 + dy;
          }
          goto LAB_002fdb2a;
        case 1:
          iVar18 = 0x17 << (bVar15 & 0x1f);
          uVar1 = left[iVar18];
          auVar35[1] = uVar1;
          auVar35[0] = uVar1;
          auVar35[2] = uVar1;
          auVar35[3] = uVar1;
          auVar35[4] = uVar1;
          auVar35[5] = uVar1;
          auVar35[6] = uVar1;
          auVar35[7] = uVar1;
          auVar35[8] = uVar1;
          auVar35[9] = uVar1;
          auVar35[10] = uVar1;
          auVar35[0xb] = uVar1;
          auVar35[0xc] = uVar1;
          auVar35[0xd] = uVar1;
          auVar35[0xe] = uVar1;
          auVar35[0xf] = uVar1;
          auVar54._8_2_ = 0x10;
          auVar54._0_8_ = 0x10001000100010;
          auVar54._10_2_ = 0x10;
          auVar54._12_2_ = 0x10;
          auVar54._14_2_ = 0x10;
          auVar54._16_2_ = 0x10;
          auVar54._18_2_ = 0x10;
          auVar54._20_2_ = 0x10;
          auVar54._22_2_ = 0x10;
          auVar54._24_2_ = 0x10;
          auVar54._26_2_ = 0x10;
          auVar54._28_2_ = 0x10;
          auVar54._30_2_ = 0x10;
          auVar74._8_2_ = 0x1f;
          auVar74._0_8_ = 0x1f001f001f001f;
          auVar74._10_2_ = 0x1f;
          auVar74._12_2_ = 0x1f;
          auVar74._14_2_ = 0x1f;
          auVar74._16_2_ = 0x1f;
          auVar74._18_2_ = 0x1f;
          auVar74._20_2_ = 0x1f;
          auVar74._22_2_ = 0x1f;
          auVar74._24_2_ = 0x1f;
          auVar74._26_2_ = 0x1f;
          auVar74._28_2_ = 0x1f;
          auVar74._30_2_ = 0x1f;
          uVar23 = dy;
          for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
            iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
            uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
            if ((int)uVar19 < 1) goto LAB_002ff247;
            uVar20 = (ulong)uVar19;
            if (0xf < uVar19) {
              uVar20 = 0x10;
            }
            auVar32 = *(undefined1 (*) [16])(left + iVar21);
            if (upsample_left == 0) {
              auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
              uVar4 = (ushort)(uVar23 >> 1);
              uVar78 = uVar4 & 0x1f;
              auVar101._0_8_ =
                   CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
              auVar101._8_2_ = uVar78;
              auVar101._10_2_ = uVar78;
              auVar101._12_2_ = uVar78;
              auVar101._14_2_ = uVar78;
              auVar101._16_2_ = uVar78;
              auVar101._18_2_ = uVar78;
              auVar101._20_2_ = uVar78;
              auVar101._22_2_ = uVar78;
              auVar101._24_2_ = uVar78;
              auVar101._26_2_ = uVar78;
              auVar101._28_2_ = uVar78;
              auVar101._30_2_ = uVar78;
            }
            else {
              auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
              auVar76 = vpsrldq_avx(auVar32,8);
              auVar100._0_2_ = (undefined2)uVar23;
              auVar100._2_2_ = auVar100._0_2_;
              auVar100._4_2_ = auVar100._0_2_;
              auVar100._6_2_ = auVar100._0_2_;
              auVar100._8_2_ = auVar100._0_2_;
              auVar100._10_2_ = auVar100._0_2_;
              auVar100._12_2_ = auVar100._0_2_;
              auVar100._14_2_ = auVar100._0_2_;
              auVar100._16_2_ = auVar100._0_2_;
              auVar100._18_2_ = auVar100._0_2_;
              auVar100._20_2_ = auVar100._0_2_;
              auVar100._22_2_ = auVar100._0_2_;
              auVar100._24_2_ = auVar100._0_2_;
              auVar100._26_2_ = auVar100._0_2_;
              auVar100._28_2_ = auVar100._0_2_;
              auVar100._30_2_ = auVar100._0_2_;
              auVar80 = vpsllw_avx2(auVar100,ZEXT416((uint)upsample_left));
              auVar80 = vpsrlw_avx2(auVar80,1);
              auVar101 = vpand_avx2(auVar80,auVar74);
            }
            auVar80 = vpmovzxbw_avx2(auVar32);
            auVar71 = vpmovzxbw_avx2(auVar76);
            auVar71 = vpsubw_avx2(auVar71,auVar80);
            auVar71 = vpmullw_avx2(auVar71,auVar101);
            auVar80 = vpsllw_avx2(auVar80,5);
            auVar80 = vpaddw_avx2(auVar80,auVar54);
            auVar80 = vpaddw_avx2(auVar71,auVar80);
            auVar80 = vpsrlw_avx2(auVar80,5);
            auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
            auVar32 = vpblendvb_avx(auVar35,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
            *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
            uVar23 = uVar23 + dy;
          }
          goto LAB_002ff250;
        default:
          return;
        case 3:
          uVar1 = left[0x2f];
          auVar33[1] = uVar1;
          auVar33[0] = uVar1;
          auVar33[2] = uVar1;
          auVar33[3] = uVar1;
          auVar33[4] = uVar1;
          auVar33[5] = uVar1;
          auVar33[6] = uVar1;
          auVar33[7] = uVar1;
          auVar33[8] = uVar1;
          auVar33[9] = uVar1;
          auVar33[10] = uVar1;
          auVar33[0xb] = uVar1;
          auVar33[0xc] = uVar1;
          auVar33[0xd] = uVar1;
          auVar33[0xe] = uVar1;
          auVar33[0xf] = uVar1;
          auVar39[0x10] = uVar1;
          auVar39._0_16_ = auVar33;
          auVar39[0x11] = uVar1;
          auVar39[0x12] = uVar1;
          auVar39[0x13] = uVar1;
          auVar39[0x14] = uVar1;
          auVar39[0x15] = uVar1;
          auVar39[0x16] = uVar1;
          auVar39[0x17] = uVar1;
          auVar39[0x18] = uVar1;
          auVar39[0x19] = uVar1;
          auVar39[0x1a] = uVar1;
          auVar39[0x1b] = uVar1;
          auVar39[0x1c] = uVar1;
          auVar39[0x1d] = uVar1;
          auVar39[0x1e] = uVar1;
          auVar39[0x1f] = uVar1;
          lVar16 = 0;
          auVar52._8_2_ = 0x10;
          auVar52._0_8_ = 0x10001000100010;
          auVar52._10_2_ = 0x10;
          auVar52._12_2_ = 0x10;
          auVar52._14_2_ = 0x10;
          auVar52._16_2_ = 0x10;
          auVar52._18_2_ = 0x10;
          auVar52._20_2_ = 0x10;
          auVar52._22_2_ = 0x10;
          auVar52._24_2_ = 0x10;
          auVar52._26_2_ = 0x10;
          auVar52._28_2_ = 0x10;
          auVar52._30_2_ = 0x10;
          lVar17 = 0;
          uVar23 = dy;
          do {
            if (lVar17 == 0x10) break;
            iVar18 = (int)uVar23 >> 6;
            lVar22 = lVar16;
            if (iVar18 < 0x2f) {
              uVar19 = -(iVar18 + -0x2f);
              uVar4 = (ushort)(uVar23 >> 1);
              uVar78 = uVar4 & 0x1f;
              auVar60._0_8_ =
                   CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
              auVar60._8_2_ = uVar78;
              auVar60._10_2_ = uVar78;
              auVar60._12_2_ = uVar78;
              auVar60._14_2_ = uVar78;
              auVar60._16_2_ = uVar78;
              auVar60._18_2_ = uVar78;
              auVar60._20_2_ = uVar78;
              auVar60._22_2_ = uVar78;
              auVar60._24_2_ = uVar78;
              auVar60._26_2_ = uVar78;
              auVar60._28_2_ = uVar78;
              auVar60._30_2_ = uVar78;
              for (lVar22 = 0; lVar22 != 0x20; lVar22 = lVar22 + 0x10) {
                auVar80 = auVar39;
                if (lVar22 < (int)uVar19) {
                  auVar80 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar22 + iVar18));
                  auVar71 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar22 + (long)iVar18 + 1))
                  ;
                  auVar71 = vpsubw_avx2(auVar71,auVar80);
                  auVar71 = vpmullw_avx2(auVar71,auVar60);
                  auVar80 = vpsllw_avx2(auVar80,5);
                  auVar80 = vpaddw_avx2(auVar80,auVar52);
                  auVar80 = vpaddw_avx2(auVar71,auVar80);
                  auVar80 = vpsrlw_avx2(auVar80,5);
                  auVar72._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar80._16_16_;
                  auVar72._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33;
                  auVar80 = vpackuswb_avx2(auVar80,auVar72);
                }
                *(undefined1 (*) [32])((long)local_1460 + lVar22 * 2) = auVar80;
              }
              if (0x1f < uVar19) {
                uVar19 = 0x20;
              }
              auVar9._16_8_ = alStack_1450[0];
              auVar9._24_8_ = alStack_1450[1];
              auVar9._0_8_ = local_1460[0];
              auVar9._8_8_ = local_1460[1];
              auVar12._16_8_ = alStack_1430[0];
              auVar12._24_8_ = alStack_1430[1];
              auVar12._0_8_ = local_1440[0];
              auVar12._8_8_ = local_1440[1];
              auVar80 = vperm2i128_avx2(auVar9,auVar12,0x20);
              auVar80 = vpblendvb_avx2(auVar39,auVar80,
                                       *(undefined1 (*) [32])(BaseMask[0] + (uVar19 << 5)));
              *(undefined1 (*) [32])(local_1060 + lVar17 * 4) = auVar80;
              uVar23 = uVar23 + dy;
            }
            else {
              for (; lVar22 != 0x200; lVar22 = lVar22 + 0x20) {
                *(undefined1 (*) [32])((long)local_1060 + lVar22) = auVar39;
              }
            }
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 0x20;
          } while (iVar18 < 0x2f);
          transpose16x32_avx2((__m256i *)local_1060,(__m256i *)local_1460);
          for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x20) {
            uVar2 = *(undefined8 *)((long)local_1460 + lVar16 + 8);
            uVar5 = *(undefined8 *)((long)alStack_1450 + lVar16);
            uVar6 = *(undefined8 *)((long)alStack_1450 + lVar16 + 8);
            *(undefined8 *)dst = *(undefined8 *)((long)local_1460 + lVar16);
            *(undefined8 *)(dst + 8) = uVar2;
            *(undefined8 *)(dst + stride * 0x10 + 0x10) = uVar5;
            *(undefined8 *)(dst + stride * 0x10 + 0x18) = uVar6;
            dst = dst + stride;
          }
          return;
        case 7:
          iVar21 = 0x20;
        }
      }
      else {
        if (bw != 0x10) {
          if (bw == 8) {
            uVar1 = left[0x27];
            auVar31[1] = uVar1;
            auVar31[0] = uVar1;
            auVar31[2] = uVar1;
            auVar31[3] = uVar1;
            auVar31[4] = uVar1;
            auVar31[5] = uVar1;
            auVar31[6] = uVar1;
            auVar31[7] = uVar1;
            auVar31[8] = uVar1;
            auVar31[9] = uVar1;
            auVar31[10] = uVar1;
            auVar31[0xb] = uVar1;
            auVar31[0xc] = uVar1;
            auVar31[0xd] = uVar1;
            auVar31[0xe] = uVar1;
            auVar31[0xf] = uVar1;
            auVar38[0x10] = uVar1;
            auVar38._0_16_ = auVar31;
            auVar38[0x11] = uVar1;
            auVar38[0x12] = uVar1;
            auVar38[0x13] = uVar1;
            auVar38[0x14] = uVar1;
            auVar38[0x15] = uVar1;
            auVar38[0x16] = uVar1;
            auVar38[0x17] = uVar1;
            auVar38[0x18] = uVar1;
            auVar38[0x19] = uVar1;
            auVar38[0x1a] = uVar1;
            auVar38[0x1b] = uVar1;
            auVar38[0x1c] = uVar1;
            auVar38[0x1d] = uVar1;
            auVar38[0x1e] = uVar1;
            auVar38[0x1f] = uVar1;
            lVar16 = 0;
            auVar50._8_2_ = 0x10;
            auVar50._0_8_ = 0x10001000100010;
            auVar50._10_2_ = 0x10;
            auVar50._12_2_ = 0x10;
            auVar50._14_2_ = 0x10;
            auVar50._16_2_ = 0x10;
            auVar50._18_2_ = 0x10;
            auVar50._20_2_ = 0x10;
            auVar50._22_2_ = 0x10;
            auVar50._24_2_ = 0x10;
            auVar50._26_2_ = 0x10;
            auVar50._28_2_ = 0x10;
            auVar50._30_2_ = 0x10;
            lVar17 = 0;
            uVar23 = dy;
            do {
              if (lVar17 == 8) break;
              iVar18 = (int)uVar23 >> 6;
              lVar22 = lVar16;
              if (iVar18 < 0x27) {
                uVar19 = -(iVar18 + -0x27);
                uVar4 = (ushort)(uVar23 >> 1);
                uVar78 = uVar4 & 0x1f;
                auVar59._0_8_ =
                     CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
                auVar59._8_2_ = uVar78;
                auVar59._10_2_ = uVar78;
                auVar59._12_2_ = uVar78;
                auVar59._14_2_ = uVar78;
                auVar59._16_2_ = uVar78;
                auVar59._18_2_ = uVar78;
                auVar59._20_2_ = uVar78;
                auVar59._22_2_ = uVar78;
                auVar59._24_2_ = uVar78;
                auVar59._26_2_ = uVar78;
                auVar59._28_2_ = uVar78;
                auVar59._30_2_ = uVar78;
                for (lVar22 = 0; lVar22 != 0x20; lVar22 = lVar22 + 0x10) {
                  auVar80 = auVar38;
                  if (lVar22 < (int)uVar19) {
                    auVar80 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar22 + iVar18));
                    auVar71 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                              (left + lVar22 + (long)iVar18 + 1));
                    auVar71 = vpsubw_avx2(auVar71,auVar80);
                    auVar71 = vpmullw_avx2(auVar71,auVar59);
                    auVar80 = vpsllw_avx2(auVar80,5);
                    auVar80 = vpaddw_avx2(auVar80,auVar50);
                    auVar80 = vpaddw_avx2(auVar71,auVar80);
                    auVar80 = vpsrlw_avx2(auVar80,5);
                    auVar69._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar80._16_16_;
                    auVar69._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
                    auVar80 = vpackuswb_avx2(auVar80,auVar69);
                  }
                  *(undefined1 (*) [32])((long)local_1460 + lVar22 * 2) = auVar80;
                }
                if (0x1f < uVar19) {
                  uVar19 = 0x20;
                }
                auVar8._16_8_ = alStack_1450[0];
                auVar8._24_8_ = alStack_1450[1];
                auVar8._0_8_ = local_1460[0];
                auVar8._8_8_ = local_1460[1];
                auVar11._16_8_ = alStack_1430[0];
                auVar11._24_8_ = alStack_1430[1];
                auVar11._0_8_ = local_1440[0];
                auVar11._8_8_ = local_1440[1];
                auVar80 = vperm2i128_avx2(auVar8,auVar11,0x20);
                auVar80 = vpblendvb_avx2(auVar38,auVar80,
                                         *(undefined1 (*) [32])(BaseMask[0] + (uVar19 << 5)));
                *(undefined1 (*) [32])(local_1060 + lVar17 * 4) = auVar80;
                uVar23 = uVar23 + dy;
              }
              else {
                for (; lVar22 != 0x100; lVar22 = lVar22 + 0x20) {
                  *(undefined1 (*) [32])((long)local_1060 + lVar22) = auVar38;
                }
              }
              lVar17 = lVar17 + 1;
              lVar16 = lVar16 + 0x20;
            } while (iVar18 < 0x27);
            for (lVar16 = 0x100; lVar16 != 0x200; lVar16 = lVar16 + 0x20) {
              *(undefined8 *)((long)local_1060 + lVar16) = 0;
              *(undefined8 *)((long)local_1060 + lVar16 + 8) = 0;
              *(undefined8 *)((long)local_1050 + lVar16) = 0;
              *(undefined8 *)((long)local_1050 + lVar16 + 8) = 0;
            }
            transpose16x32_avx2((__m256i *)local_1060,(__m256i *)local_1460);
            puVar13 = dst;
            for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x20) {
              *(undefined8 *)puVar13 = *(undefined8 *)((long)local_1460 + lVar16);
              puVar13 = puVar13 + stride;
            }
            puVar13 = dst + stride * 0x10;
            for (lVar16 = 0x10; lVar16 != 0x210; lVar16 = lVar16 + 0x20) {
              *(undefined8 *)puVar13 = *(undefined8 *)((long)local_1460 + lVar16);
              puVar13 = puVar13 + stride;
            }
            return;
          }
          if (bw != 4) {
            return;
          }
          iVar18 = 0x13 << (bVar15 & 0x1f);
          uVar1 = left[iVar18];
          auVar27[1] = uVar1;
          auVar27[0] = uVar1;
          auVar27[2] = uVar1;
          auVar27[3] = uVar1;
          auVar27[4] = uVar1;
          auVar27[5] = uVar1;
          auVar27[6] = uVar1;
          auVar27[7] = uVar1;
          auVar27[8] = uVar1;
          auVar27[9] = uVar1;
          auVar27[10] = uVar1;
          auVar27[0xb] = uVar1;
          auVar27[0xc] = uVar1;
          auVar27[0xd] = uVar1;
          auVar27[0xe] = uVar1;
          auVar27[0xf] = uVar1;
          auVar45._8_2_ = 0x10;
          auVar45._0_8_ = 0x10001000100010;
          auVar45._10_2_ = 0x10;
          auVar45._12_2_ = 0x10;
          auVar45._14_2_ = 0x10;
          auVar45._16_2_ = 0x10;
          auVar45._18_2_ = 0x10;
          auVar45._20_2_ = 0x10;
          auVar45._22_2_ = 0x10;
          auVar45._24_2_ = 0x10;
          auVar45._26_2_ = 0x10;
          auVar45._28_2_ = 0x10;
          auVar45._30_2_ = 0x10;
          auVar64._8_2_ = 0x1f;
          auVar64._0_8_ = 0x1f001f001f001f;
          auVar64._10_2_ = 0x1f;
          auVar64._12_2_ = 0x1f;
          auVar64._14_2_ = 0x1f;
          auVar64._16_2_ = 0x1f;
          auVar64._18_2_ = 0x1f;
          auVar64._20_2_ = 0x1f;
          auVar64._22_2_ = 0x1f;
          auVar64._24_2_ = 0x1f;
          auVar64._26_2_ = 0x1f;
          auVar64._28_2_ = 0x1f;
          auVar64._30_2_ = 0x1f;
          uVar23 = dy;
          for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
            iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
            uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
            if ((int)uVar19 < 1) goto LAB_002fdec7;
            uVar20 = (ulong)uVar19;
            if (0xf < uVar19) {
              uVar20 = 0x10;
            }
            auVar32 = *(undefined1 (*) [16])(left + iVar21);
            if (upsample_left == 0) {
              auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
              uVar4 = (ushort)(uVar23 >> 1);
              uVar78 = uVar4 & 0x1f;
              auVar87._0_8_ =
                   CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
              auVar87._8_2_ = uVar78;
              auVar87._10_2_ = uVar78;
              auVar87._12_2_ = uVar78;
              auVar87._14_2_ = uVar78;
              auVar87._16_2_ = uVar78;
              auVar87._18_2_ = uVar78;
              auVar87._20_2_ = uVar78;
              auVar87._22_2_ = uVar78;
              auVar87._24_2_ = uVar78;
              auVar87._26_2_ = uVar78;
              auVar87._28_2_ = uVar78;
              auVar87._30_2_ = uVar78;
            }
            else {
              auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
              auVar76 = vpsrldq_avx(auVar32,8);
              auVar86._0_2_ = (undefined2)uVar23;
              auVar86._2_2_ = auVar86._0_2_;
              auVar86._4_2_ = auVar86._0_2_;
              auVar86._6_2_ = auVar86._0_2_;
              auVar86._8_2_ = auVar86._0_2_;
              auVar86._10_2_ = auVar86._0_2_;
              auVar86._12_2_ = auVar86._0_2_;
              auVar86._14_2_ = auVar86._0_2_;
              auVar86._16_2_ = auVar86._0_2_;
              auVar86._18_2_ = auVar86._0_2_;
              auVar86._20_2_ = auVar86._0_2_;
              auVar86._22_2_ = auVar86._0_2_;
              auVar86._24_2_ = auVar86._0_2_;
              auVar86._26_2_ = auVar86._0_2_;
              auVar86._28_2_ = auVar86._0_2_;
              auVar86._30_2_ = auVar86._0_2_;
              auVar80 = vpsllw_avx2(auVar86,ZEXT416((uint)upsample_left));
              auVar80 = vpsrlw_avx2(auVar80,1);
              auVar87 = vpand_avx2(auVar80,auVar64);
            }
            auVar80 = vpmovzxbw_avx2(auVar32);
            auVar71 = vpmovzxbw_avx2(auVar76);
            auVar71 = vpsubw_avx2(auVar71,auVar80);
            auVar71 = vpmullw_avx2(auVar71,auVar87);
            auVar80 = vpsllw_avx2(auVar80,5);
            auVar80 = vpaddw_avx2(auVar80,auVar45);
            auVar80 = vpaddw_avx2(auVar71,auVar80);
            auVar80 = vpsrlw_avx2(auVar80,5);
            auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
            auVar32 = vpblendvb_avx(auVar27,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
            *(undefined1 (*) [16])((long)local_1460 + lVar16) = auVar32;
            uVar23 = uVar23 + dy;
          }
          goto LAB_002fdecd;
        }
        iVar21 = 0x10;
      }
      pitchSrc = 0x40;
      dr_prediction_z1_64xN_avx2(iVar21,(uint8_t *)local_1060,0x40,left,dy,iVar18);
      iVar18 = 0x40;
      goto LAB_002ff603;
    }
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        iVar18 = 0x4f << (bVar15 & 0x1f);
        uVar1 = left[iVar18];
        auVar32[1] = uVar1;
        auVar32[0] = uVar1;
        auVar32[2] = uVar1;
        auVar32[3] = uVar1;
        auVar32[4] = uVar1;
        auVar32[5] = uVar1;
        auVar32[6] = uVar1;
        auVar32[7] = uVar1;
        auVar32[8] = uVar1;
        auVar32[9] = uVar1;
        auVar32[10] = uVar1;
        auVar32[0xb] = uVar1;
        auVar32[0xc] = uVar1;
        auVar32[0xd] = uVar1;
        auVar32[0xe] = uVar1;
        auVar32[0xf] = uVar1;
        auVar80._8_2_ = 0x10;
        auVar80._0_8_ = 0x10001000100010;
        auVar80._10_2_ = 0x10;
        auVar80._12_2_ = 0x10;
        auVar80._14_2_ = 0x10;
        auVar80._16_2_ = 0x10;
        auVar80._18_2_ = 0x10;
        auVar80._20_2_ = 0x10;
        auVar80._22_2_ = 0x10;
        auVar80._24_2_ = 0x10;
        auVar80._26_2_ = 0x10;
        auVar80._28_2_ = 0x10;
        auVar80._30_2_ = 0x10;
        auVar71._8_2_ = 0x1f;
        auVar71._0_8_ = 0x1f001f001f001f;
        auVar71._10_2_ = 0x1f;
        auVar71._12_2_ = 0x1f;
        auVar71._14_2_ = 0x1f;
        auVar71._16_2_ = 0x1f;
        auVar71._18_2_ = 0x1f;
        auVar71._20_2_ = 0x1f;
        auVar71._22_2_ = 0x1f;
        auVar71._24_2_ = 0x1f;
        auVar71._26_2_ = 0x1f;
        auVar71._28_2_ = 0x1f;
        auVar71._30_2_ = 0x1f;
        uVar23 = dy;
        for (lVar16 = 0; lVar16 != 0x400; lVar16 = lVar16 + 0x10) {
          iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
          uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
          if ((int)uVar19 < 1) goto LAB_002fece3;
          uVar20 = (ulong)uVar19;
          if (0xf < uVar19) {
            uVar20 = 0x10;
          }
          auVar76 = *(undefined1 (*) [16])(left + iVar21);
          if (upsample_left == 0) {
            auVar77 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
            uVar4 = (ushort)(uVar23 >> 1);
            uVar78 = uVar4 & 0x1f;
            auVar97._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f
            ;
            auVar97._8_2_ = uVar78;
            auVar97._10_2_ = uVar78;
            auVar97._12_2_ = uVar78;
            auVar97._14_2_ = uVar78;
            auVar97._16_2_ = uVar78;
            auVar97._18_2_ = uVar78;
            auVar97._20_2_ = uVar78;
            auVar97._22_2_ = uVar78;
            auVar97._24_2_ = uVar78;
            auVar97._26_2_ = uVar78;
            auVar97._28_2_ = uVar78;
            auVar97._30_2_ = uVar78;
          }
          else {
            auVar76 = vpshufb_avx(auVar76,_DAT_0046de30);
            auVar77 = vpsrldq_avx(auVar76,8);
            auVar96._0_2_ = (undefined2)uVar23;
            auVar96._2_2_ = auVar96._0_2_;
            auVar96._4_2_ = auVar96._0_2_;
            auVar96._6_2_ = auVar96._0_2_;
            auVar96._8_2_ = auVar96._0_2_;
            auVar96._10_2_ = auVar96._0_2_;
            auVar96._12_2_ = auVar96._0_2_;
            auVar96._14_2_ = auVar96._0_2_;
            auVar96._16_2_ = auVar96._0_2_;
            auVar96._18_2_ = auVar96._0_2_;
            auVar96._20_2_ = auVar96._0_2_;
            auVar96._22_2_ = auVar96._0_2_;
            auVar96._24_2_ = auVar96._0_2_;
            auVar96._26_2_ = auVar96._0_2_;
            auVar96._28_2_ = auVar96._0_2_;
            auVar96._30_2_ = auVar96._0_2_;
            auVar97 = vpsllw_avx2(auVar96,ZEXT416((uint)upsample_left));
            auVar97 = vpsrlw_avx2(auVar97,1);
            auVar97 = vpand_avx2(auVar97,auVar71);
          }
          auVar96 = vpmovzxbw_avx2(auVar76);
          auVar51 = vpmovzxbw_avx2(auVar77);
          auVar51 = vpsubw_avx2(auVar51,auVar96);
          auVar51 = vpmullw_avx2(auVar51,auVar97);
          auVar97 = vpsllw_avx2(auVar96,5);
          auVar97 = vpaddw_avx2(auVar97,auVar80);
          auVar97 = vpaddw_avx2(auVar51,auVar97);
          auVar97 = vpsrlw_avx2(auVar97,5);
          auVar76 = vpackuswb_avx(auVar97._0_16_,auVar97._16_16_);
          auVar76 = vpblendvb_avx(auVar32,auVar76,*(undefined1 (*) [16])BaseMask[uVar20]);
          *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar76;
          uVar23 = uVar23 + dy;
        }
        goto LAB_002fecec;
      }
      if (bh == 8) {
        iVar18 = 0x27 << (bVar15 & 0x1f);
        uVar1 = left[iVar18];
        auVar76[1] = uVar1;
        auVar76[0] = uVar1;
        auVar76[2] = uVar1;
        auVar76[3] = uVar1;
        auVar76[4] = uVar1;
        auVar76[5] = uVar1;
        auVar76[6] = uVar1;
        auVar76[7] = uVar1;
        auVar76[8] = uVar1;
        auVar76[9] = uVar1;
        auVar76[10] = uVar1;
        auVar76[0xb] = uVar1;
        auVar76[0xc] = uVar1;
        auVar76[0xd] = uVar1;
        auVar76[0xe] = uVar1;
        auVar76[0xf] = uVar1;
        auVar51._8_2_ = 0x10;
        auVar51._0_8_ = 0x10001000100010;
        auVar51._10_2_ = 0x10;
        auVar51._12_2_ = 0x10;
        auVar51._14_2_ = 0x10;
        auVar51._16_2_ = 0x10;
        auVar51._18_2_ = 0x10;
        auVar51._20_2_ = 0x10;
        auVar51._22_2_ = 0x10;
        auVar51._24_2_ = 0x10;
        auVar51._26_2_ = 0x10;
        auVar51._28_2_ = 0x10;
        auVar51._30_2_ = 0x10;
        auVar70._8_2_ = 0x1f;
        auVar70._0_8_ = 0x1f001f001f001f;
        auVar70._10_2_ = 0x1f;
        auVar70._12_2_ = 0x1f;
        auVar70._14_2_ = 0x1f;
        auVar70._16_2_ = 0x1f;
        auVar70._18_2_ = 0x1f;
        auVar70._20_2_ = 0x1f;
        auVar70._22_2_ = 0x1f;
        auVar70._24_2_ = 0x1f;
        auVar70._26_2_ = 0x1f;
        auVar70._28_2_ = 0x1f;
        auVar70._30_2_ = 0x1f;
        uVar23 = dy;
        for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
          iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
          uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
          if ((int)uVar19 < 1) goto LAB_002fe8fd;
          uVar20 = (ulong)uVar19;
          if (7 < uVar19) {
            uVar20 = 8;
          }
          auVar32 = *(undefined1 (*) [16])(left + iVar21);
          if (upsample_left == 0) {
            auVar77 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
            uVar4 = (ushort)(uVar23 >> 1);
            uVar78 = uVar4 & 0x1f;
            auVar95._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f
            ;
            auVar95._8_2_ = uVar78;
            auVar95._10_2_ = uVar78;
            auVar95._12_2_ = uVar78;
            auVar95._14_2_ = uVar78;
            auVar95._16_2_ = uVar78;
            auVar95._18_2_ = uVar78;
            auVar95._20_2_ = uVar78;
            auVar95._22_2_ = uVar78;
            auVar95._24_2_ = uVar78;
            auVar95._26_2_ = uVar78;
            auVar95._28_2_ = uVar78;
            auVar95._30_2_ = uVar78;
          }
          else {
            auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
            auVar77 = vpsrldq_avx(auVar32,8);
            auVar94._0_2_ = (undefined2)uVar23;
            auVar94._2_2_ = auVar94._0_2_;
            auVar94._4_2_ = auVar94._0_2_;
            auVar94._6_2_ = auVar94._0_2_;
            auVar94._8_2_ = auVar94._0_2_;
            auVar94._10_2_ = auVar94._0_2_;
            auVar94._12_2_ = auVar94._0_2_;
            auVar94._14_2_ = auVar94._0_2_;
            auVar94._16_2_ = auVar94._0_2_;
            auVar94._18_2_ = auVar94._0_2_;
            auVar94._20_2_ = auVar94._0_2_;
            auVar94._22_2_ = auVar94._0_2_;
            auVar94._24_2_ = auVar94._0_2_;
            auVar94._26_2_ = auVar94._0_2_;
            auVar94._28_2_ = auVar94._0_2_;
            auVar94._30_2_ = auVar94._0_2_;
            auVar80 = vpsllw_avx2(auVar94,ZEXT416((uint)upsample_left));
            auVar80 = vpsrlw_avx2(auVar80,1);
            auVar95 = vpand_avx2(auVar80,auVar70);
          }
          auVar80 = vpmovzxbw_avx2(auVar32);
          auVar71 = vpmovzxbw_avx2(auVar77);
          auVar71 = vpsubw_avx2(auVar71,auVar80);
          auVar71 = vpmullw_avx2(auVar71,auVar95);
          auVar80 = vpsllw_avx2(auVar80,5);
          auVar80 = vpaddw_avx2(auVar80,auVar51);
          auVar80 = vpaddw_avx2(auVar71,auVar80);
          auVar80 = vpsrlw_avx2(auVar80,5);
          auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
          auVar32 = vpblendvb_avx(auVar76,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
          *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
          uVar23 = uVar23 + dy;
        }
        goto LAB_002fe906;
      }
      if (bh != 4) {
        return;
      }
      iVar18 = 0x13 << (bVar15 & 0x1f);
      uVar1 = left[iVar18];
      auVar77[1] = uVar1;
      auVar77[0] = uVar1;
      auVar77[2] = uVar1;
      auVar77[3] = uVar1;
      auVar77[4] = uVar1;
      auVar77[5] = uVar1;
      auVar77[6] = uVar1;
      auVar77[7] = uVar1;
      auVar77[8] = uVar1;
      auVar77[9] = uVar1;
      auVar77[10] = uVar1;
      auVar77[0xb] = uVar1;
      auVar77[0xc] = uVar1;
      auVar77[0xd] = uVar1;
      auVar77[0xe] = uVar1;
      auVar77[0xf] = uVar1;
      auVar46._8_2_ = 0x10;
      auVar46._0_8_ = 0x10001000100010;
      auVar46._10_2_ = 0x10;
      auVar46._12_2_ = 0x10;
      auVar46._14_2_ = 0x10;
      auVar46._16_2_ = 0x10;
      auVar46._18_2_ = 0x10;
      auVar46._20_2_ = 0x10;
      auVar46._22_2_ = 0x10;
      auVar46._24_2_ = 0x10;
      auVar46._26_2_ = 0x10;
      auVar46._28_2_ = 0x10;
      auVar46._30_2_ = 0x10;
      auVar65._8_2_ = 0x1f;
      auVar65._0_8_ = 0x1f001f001f001f;
      auVar65._10_2_ = 0x1f;
      auVar65._12_2_ = 0x1f;
      auVar65._14_2_ = 0x1f;
      auVar65._16_2_ = 0x1f;
      auVar65._18_2_ = 0x1f;
      auVar65._20_2_ = 0x1f;
      auVar65._22_2_ = 0x1f;
      auVar65._24_2_ = 0x1f;
      auVar65._26_2_ = 0x1f;
      auVar65._28_2_ = 0x1f;
      auVar65._30_2_ = 0x1f;
      uVar23 = dy;
      for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
        iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
        uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
        if ((int)uVar19 < 1) goto LAB_002fe14c;
        uVar20 = (ulong)uVar19;
        if (3 < uVar19) {
          uVar20 = 4;
        }
        auVar32 = *(undefined1 (*) [16])(left + iVar21);
        if (upsample_left == 0) {
          auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
          uVar4 = (ushort)(uVar23 >> 1);
          uVar78 = uVar4 & 0x1f;
          auVar89._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar89._8_2_ = uVar78;
          auVar89._10_2_ = uVar78;
          auVar89._12_2_ = uVar78;
          auVar89._14_2_ = uVar78;
          auVar89._16_2_ = uVar78;
          auVar89._18_2_ = uVar78;
          auVar89._20_2_ = uVar78;
          auVar89._22_2_ = uVar78;
          auVar89._24_2_ = uVar78;
          auVar89._26_2_ = uVar78;
          auVar89._28_2_ = uVar78;
          auVar89._30_2_ = uVar78;
        }
        else {
          auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
          auVar76 = vpsrldq_avx(auVar32,8);
          auVar88._0_2_ = (undefined2)uVar23;
          auVar88._2_2_ = auVar88._0_2_;
          auVar88._4_2_ = auVar88._0_2_;
          auVar88._6_2_ = auVar88._0_2_;
          auVar88._8_2_ = auVar88._0_2_;
          auVar88._10_2_ = auVar88._0_2_;
          auVar88._12_2_ = auVar88._0_2_;
          auVar88._14_2_ = auVar88._0_2_;
          auVar88._16_2_ = auVar88._0_2_;
          auVar88._18_2_ = auVar88._0_2_;
          auVar88._20_2_ = auVar88._0_2_;
          auVar88._22_2_ = auVar88._0_2_;
          auVar88._24_2_ = auVar88._0_2_;
          auVar88._26_2_ = auVar88._0_2_;
          auVar88._28_2_ = auVar88._0_2_;
          auVar88._30_2_ = auVar88._0_2_;
          auVar80 = vpsllw_avx2(auVar88,ZEXT416((uint)upsample_left));
          auVar80 = vpsrlw_avx2(auVar80,1);
          auVar89 = vpand_avx2(auVar80,auVar65);
        }
        auVar80 = vpmovzxbw_avx2(auVar32);
        auVar71 = vpmovzxbw_avx2(auVar76);
        auVar71 = vpsubw_avx2(auVar71,auVar80);
        auVar71 = vpmullw_avx2(auVar71,auVar89);
        auVar80 = vpsllw_avx2(auVar80,5);
        auVar80 = vpaddw_avx2(auVar80,auVar46);
        auVar80 = vpaddw_avx2(auVar71,auVar80);
        auVar80 = vpsrlw_avx2(auVar80,5);
        auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
        auVar32 = vpblendvb_avx(auVar77,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
        *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
        uVar23 = uVar23 + dy;
      }
      goto LAB_002fe155;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar18 = 0xb << (bVar15 & 0x1f);
      uVar1 = left[iVar18];
      auVar26[1] = uVar1;
      auVar26[0] = uVar1;
      auVar26[2] = uVar1;
      auVar26[3] = uVar1;
      auVar26[4] = uVar1;
      auVar26[5] = uVar1;
      auVar26[6] = uVar1;
      auVar26[7] = uVar1;
      auVar26[8] = uVar1;
      auVar26[9] = uVar1;
      auVar26[10] = uVar1;
      auVar26[0xb] = uVar1;
      auVar26[0xc] = uVar1;
      auVar26[0xd] = uVar1;
      auVar26[0xe] = uVar1;
      auVar26[0xf] = uVar1;
      auVar44._8_2_ = 0x10;
      auVar44._0_8_ = 0x10001000100010;
      auVar44._10_2_ = 0x10;
      auVar44._12_2_ = 0x10;
      auVar44._14_2_ = 0x10;
      auVar44._16_2_ = 0x10;
      auVar44._18_2_ = 0x10;
      auVar44._20_2_ = 0x10;
      auVar44._22_2_ = 0x10;
      auVar44._24_2_ = 0x10;
      auVar44._26_2_ = 0x10;
      auVar44._28_2_ = 0x10;
      auVar44._30_2_ = 0x10;
      auVar63._8_2_ = 0x1f;
      auVar63._0_8_ = 0x1f001f001f001f;
      auVar63._10_2_ = 0x1f;
      auVar63._12_2_ = 0x1f;
      auVar63._14_2_ = 0x1f;
      auVar63._16_2_ = 0x1f;
      auVar63._18_2_ = 0x1f;
      auVar63._20_2_ = 0x1f;
      auVar63._22_2_ = 0x1f;
      auVar63._24_2_ = 0x1f;
      auVar63._26_2_ = 0x1f;
      auVar63._28_2_ = 0x1f;
      auVar63._30_2_ = 0x1f;
      uVar23 = dy;
      for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
        iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
        uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
        if ((int)uVar19 < 1) goto LAB_002fdd1a;
        uVar20 = (ulong)uVar19;
        if (3 < uVar19) {
          uVar20 = 4;
        }
        auVar32 = *(undefined1 (*) [16])(left + iVar21);
        if (upsample_left == 0) {
          auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
          uVar4 = (ushort)(uVar23 >> 1);
          uVar78 = uVar4 & 0x1f;
          auVar85._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar85._8_2_ = uVar78;
          auVar85._10_2_ = uVar78;
          auVar85._12_2_ = uVar78;
          auVar85._14_2_ = uVar78;
          auVar85._16_2_ = uVar78;
          auVar85._18_2_ = uVar78;
          auVar85._20_2_ = uVar78;
          auVar85._22_2_ = uVar78;
          auVar85._24_2_ = uVar78;
          auVar85._26_2_ = uVar78;
          auVar85._28_2_ = uVar78;
          auVar85._30_2_ = uVar78;
        }
        else {
          auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
          auVar76 = vpsrldq_avx(auVar32,8);
          auVar84._0_2_ = (undefined2)uVar23;
          auVar84._2_2_ = auVar84._0_2_;
          auVar84._4_2_ = auVar84._0_2_;
          auVar84._6_2_ = auVar84._0_2_;
          auVar84._8_2_ = auVar84._0_2_;
          auVar84._10_2_ = auVar84._0_2_;
          auVar84._12_2_ = auVar84._0_2_;
          auVar84._14_2_ = auVar84._0_2_;
          auVar84._16_2_ = auVar84._0_2_;
          auVar84._18_2_ = auVar84._0_2_;
          auVar84._20_2_ = auVar84._0_2_;
          auVar84._22_2_ = auVar84._0_2_;
          auVar84._24_2_ = auVar84._0_2_;
          auVar84._26_2_ = auVar84._0_2_;
          auVar84._28_2_ = auVar84._0_2_;
          auVar84._30_2_ = auVar84._0_2_;
          auVar80 = vpsllw_avx2(auVar84,ZEXT416((uint)upsample_left));
          auVar80 = vpsrlw_avx2(auVar80,1);
          auVar85 = vpand_avx2(auVar80,auVar63);
        }
        auVar80 = vpmovzxbw_avx2(auVar32);
        auVar71 = vpmovzxbw_avx2(auVar76);
        auVar71 = vpsubw_avx2(auVar71,auVar80);
        auVar71 = vpmullw_avx2(auVar71,auVar85);
        auVar80 = vpsllw_avx2(auVar80,5);
        auVar80 = vpaddw_avx2(auVar80,auVar44);
        auVar80 = vpaddw_avx2(auVar71,auVar80);
        auVar80 = vpsrlw_avx2(auVar80,5);
        auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
        auVar32 = vpblendvb_avx(auVar26,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
        *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
        uVar23 = uVar23 + dy;
      }
      break;
    case 1:
      iVar18 = 0x17 << (bVar15 & 0x1f);
      uVar1 = left[iVar18];
      auVar36[1] = uVar1;
      auVar36[0] = uVar1;
      auVar36[2] = uVar1;
      auVar36[3] = uVar1;
      auVar36[4] = uVar1;
      auVar36[5] = uVar1;
      auVar36[6] = uVar1;
      auVar36[7] = uVar1;
      auVar36[8] = uVar1;
      auVar36[9] = uVar1;
      auVar36[10] = uVar1;
      auVar36[0xb] = uVar1;
      auVar36[0xc] = uVar1;
      auVar36[0xd] = uVar1;
      auVar36[0xe] = uVar1;
      auVar36[0xf] = uVar1;
      auVar55._8_2_ = 0x10;
      auVar55._0_8_ = 0x10001000100010;
      auVar55._10_2_ = 0x10;
      auVar55._12_2_ = 0x10;
      auVar55._14_2_ = 0x10;
      auVar55._16_2_ = 0x10;
      auVar55._18_2_ = 0x10;
      auVar55._20_2_ = 0x10;
      auVar55._22_2_ = 0x10;
      auVar55._24_2_ = 0x10;
      auVar55._26_2_ = 0x10;
      auVar55._28_2_ = 0x10;
      auVar55._30_2_ = 0x10;
      auVar75._8_2_ = 0x1f;
      auVar75._0_8_ = 0x1f001f001f001f;
      auVar75._10_2_ = 0x1f;
      auVar75._12_2_ = 0x1f;
      auVar75._14_2_ = 0x1f;
      auVar75._16_2_ = 0x1f;
      auVar75._18_2_ = 0x1f;
      auVar75._20_2_ = 0x1f;
      auVar75._22_2_ = 0x1f;
      auVar75._24_2_ = 0x1f;
      auVar75._26_2_ = 0x1f;
      auVar75._28_2_ = 0x1f;
      auVar75._30_2_ = 0x1f;
      uVar23 = dy;
      for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
        iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
        uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
        if ((int)uVar19 < 1) goto LAB_002ff4a3;
        uVar20 = (ulong)uVar19;
        if (7 < uVar19) {
          uVar20 = 8;
        }
        auVar32 = *(undefined1 (*) [16])(left + iVar21);
        if (upsample_left == 0) {
          auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
          uVar4 = (ushort)(uVar23 >> 1);
          uVar78 = uVar4 & 0x1f;
          auVar103._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar103._8_2_ = uVar78;
          auVar103._10_2_ = uVar78;
          auVar103._12_2_ = uVar78;
          auVar103._14_2_ = uVar78;
          auVar103._16_2_ = uVar78;
          auVar103._18_2_ = uVar78;
          auVar103._20_2_ = uVar78;
          auVar103._22_2_ = uVar78;
          auVar103._24_2_ = uVar78;
          auVar103._26_2_ = uVar78;
          auVar103._28_2_ = uVar78;
          auVar103._30_2_ = uVar78;
        }
        else {
          auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
          auVar76 = vpsrldq_avx(auVar32,8);
          auVar102._0_2_ = (undefined2)uVar23;
          auVar102._2_2_ = auVar102._0_2_;
          auVar102._4_2_ = auVar102._0_2_;
          auVar102._6_2_ = auVar102._0_2_;
          auVar102._8_2_ = auVar102._0_2_;
          auVar102._10_2_ = auVar102._0_2_;
          auVar102._12_2_ = auVar102._0_2_;
          auVar102._14_2_ = auVar102._0_2_;
          auVar102._16_2_ = auVar102._0_2_;
          auVar102._18_2_ = auVar102._0_2_;
          auVar102._20_2_ = auVar102._0_2_;
          auVar102._22_2_ = auVar102._0_2_;
          auVar102._24_2_ = auVar102._0_2_;
          auVar102._26_2_ = auVar102._0_2_;
          auVar102._28_2_ = auVar102._0_2_;
          auVar102._30_2_ = auVar102._0_2_;
          auVar80 = vpsllw_avx2(auVar102,ZEXT416((uint)upsample_left));
          auVar80 = vpsrlw_avx2(auVar80,1);
          auVar103 = vpand_avx2(auVar80,auVar75);
        }
        auVar80 = vpmovzxbw_avx2(auVar32);
        auVar71 = vpmovzxbw_avx2(auVar76);
        auVar71 = vpsubw_avx2(auVar71,auVar80);
        auVar71 = vpmullw_avx2(auVar71,auVar103);
        auVar80 = vpsllw_avx2(auVar80,5);
        auVar80 = vpaddw_avx2(auVar80,auVar55);
        auVar80 = vpaddw_avx2(auVar71,auVar80);
        auVar80 = vpsrlw_avx2(auVar80,5);
        auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
        auVar32 = vpblendvb_avx(auVar36,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
        *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
        uVar23 = uVar23 + dy;
      }
      goto LAB_002ff4ac;
    default:
      return;
    case 3:
      iVar18 = 0x2f << (bVar15 & 0x1f);
      uVar1 = left[iVar18];
      auVar34[1] = uVar1;
      auVar34[0] = uVar1;
      auVar34[2] = uVar1;
      auVar34[3] = uVar1;
      auVar34[4] = uVar1;
      auVar34[5] = uVar1;
      auVar34[6] = uVar1;
      auVar34[7] = uVar1;
      auVar34[8] = uVar1;
      auVar34[9] = uVar1;
      auVar34[10] = uVar1;
      auVar34[0xb] = uVar1;
      auVar34[0xc] = uVar1;
      auVar34[0xd] = uVar1;
      auVar34[0xe] = uVar1;
      auVar34[0xf] = uVar1;
      auVar53._8_2_ = 0x10;
      auVar53._0_8_ = 0x10001000100010;
      auVar53._10_2_ = 0x10;
      auVar53._12_2_ = 0x10;
      auVar53._14_2_ = 0x10;
      auVar53._16_2_ = 0x10;
      auVar53._18_2_ = 0x10;
      auVar53._20_2_ = 0x10;
      auVar53._22_2_ = 0x10;
      auVar53._24_2_ = 0x10;
      auVar53._26_2_ = 0x10;
      auVar53._28_2_ = 0x10;
      auVar53._30_2_ = 0x10;
      auVar73._8_2_ = 0x1f;
      auVar73._0_8_ = 0x1f001f001f001f;
      auVar73._10_2_ = 0x1f;
      auVar73._12_2_ = 0x1f;
      auVar73._14_2_ = 0x1f;
      auVar73._16_2_ = 0x1f;
      auVar73._18_2_ = 0x1f;
      auVar73._20_2_ = 0x1f;
      auVar73._22_2_ = 0x1f;
      auVar73._24_2_ = 0x1f;
      auVar73._26_2_ = 0x1f;
      auVar73._28_2_ = 0x1f;
      auVar73._30_2_ = 0x1f;
      uVar23 = dy;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
        uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
        if ((int)uVar19 < 1) goto LAB_002ff0c5;
        uVar20 = (ulong)uVar19;
        if (0xf < uVar19) {
          uVar20 = 0x10;
        }
        auVar32 = *(undefined1 (*) [16])(left + iVar21);
        if (upsample_left == 0) {
          auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
          uVar4 = (ushort)(uVar23 >> 1);
          uVar78 = uVar4 & 0x1f;
          auVar99._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar99._8_2_ = uVar78;
          auVar99._10_2_ = uVar78;
          auVar99._12_2_ = uVar78;
          auVar99._14_2_ = uVar78;
          auVar99._16_2_ = uVar78;
          auVar99._18_2_ = uVar78;
          auVar99._20_2_ = uVar78;
          auVar99._22_2_ = uVar78;
          auVar99._24_2_ = uVar78;
          auVar99._26_2_ = uVar78;
          auVar99._28_2_ = uVar78;
          auVar99._30_2_ = uVar78;
        }
        else {
          auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
          auVar76 = vpsrldq_avx(auVar32,8);
          auVar98._0_2_ = (undefined2)uVar23;
          auVar98._2_2_ = auVar98._0_2_;
          auVar98._4_2_ = auVar98._0_2_;
          auVar98._6_2_ = auVar98._0_2_;
          auVar98._8_2_ = auVar98._0_2_;
          auVar98._10_2_ = auVar98._0_2_;
          auVar98._12_2_ = auVar98._0_2_;
          auVar98._14_2_ = auVar98._0_2_;
          auVar98._16_2_ = auVar98._0_2_;
          auVar98._18_2_ = auVar98._0_2_;
          auVar98._20_2_ = auVar98._0_2_;
          auVar98._22_2_ = auVar98._0_2_;
          auVar98._24_2_ = auVar98._0_2_;
          auVar98._26_2_ = auVar98._0_2_;
          auVar98._28_2_ = auVar98._0_2_;
          auVar98._30_2_ = auVar98._0_2_;
          auVar80 = vpsllw_avx2(auVar98,ZEXT416((uint)upsample_left));
          auVar80 = vpsrlw_avx2(auVar80,1);
          auVar99 = vpand_avx2(auVar80,auVar73);
        }
        auVar80 = vpmovzxbw_avx2(auVar32);
        auVar71 = vpmovzxbw_avx2(auVar76);
        auVar71 = vpsubw_avx2(auVar71,auVar80);
        auVar71 = vpmullw_avx2(auVar71,auVar99);
        auVar80 = vpsllw_avx2(auVar80,5);
        auVar80 = vpaddw_avx2(auVar80,auVar53);
        auVar80 = vpaddw_avx2(auVar71,auVar80);
        auVar80 = vpsrlw_avx2(auVar80,5);
        auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
        auVar32 = vpblendvb_avx(auVar34,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
        *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
        uVar23 = uVar23 + dy;
      }
      goto LAB_002ff0ce;
    case 7:
      pitchSrc = 0x20;
      iVar21 = 0x40;
      dr_prediction_z1_32xN_avx2(0x40,(uint8_t *)local_1060,0x20,left,dy,iVar18);
      iVar18 = 0x20;
      goto LAB_002ff603;
    }
    goto LAB_002fdd23;
  }
  if (bw == 0x40) {
    pitchSrc = 0x40;
    iVar21 = 0x40;
    dr_prediction_z1_64xN_avx2(0x40,(uint8_t *)local_1060,0x40,left,dy,iVar18);
    iVar18 = iVar21;
LAB_002ff603:
    transpose((uint8_t *)local_1060,pitchSrc,dst,stride,iVar21,iVar18);
    return;
  }
  if (bw != 8) {
    if (bw == 0x10) {
      iVar18 = 0x1f << (bVar15 & 0x1f);
      uVar1 = left[iVar18];
      auVar30[1] = uVar1;
      auVar30[0] = uVar1;
      auVar30[2] = uVar1;
      auVar30[3] = uVar1;
      auVar30[4] = uVar1;
      auVar30[5] = uVar1;
      auVar30[6] = uVar1;
      auVar30[7] = uVar1;
      auVar30[8] = uVar1;
      auVar30[9] = uVar1;
      auVar30[10] = uVar1;
      auVar30[0xb] = uVar1;
      auVar30[0xc] = uVar1;
      auVar30[0xd] = uVar1;
      auVar30[0xe] = uVar1;
      auVar30[0xf] = uVar1;
      auVar49._8_2_ = 0x10;
      auVar49._0_8_ = 0x10001000100010;
      auVar49._10_2_ = 0x10;
      auVar49._12_2_ = 0x10;
      auVar49._14_2_ = 0x10;
      auVar49._16_2_ = 0x10;
      auVar49._18_2_ = 0x10;
      auVar49._20_2_ = 0x10;
      auVar49._22_2_ = 0x10;
      auVar49._24_2_ = 0x10;
      auVar49._26_2_ = 0x10;
      auVar49._28_2_ = 0x10;
      auVar49._30_2_ = 0x10;
      auVar68._8_2_ = 0x1f;
      auVar68._0_8_ = 0x1f001f001f001f;
      auVar68._10_2_ = 0x1f;
      auVar68._12_2_ = 0x1f;
      auVar68._14_2_ = 0x1f;
      auVar68._16_2_ = 0x1f;
      auVar68._18_2_ = 0x1f;
      auVar68._20_2_ = 0x1f;
      auVar68._22_2_ = 0x1f;
      auVar68._24_2_ = 0x1f;
      auVar68._26_2_ = 0x1f;
      auVar68._28_2_ = 0x1f;
      auVar68._30_2_ = 0x1f;
      uVar23 = dy;
      for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
        iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
        uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
        if ((int)uVar19 < 1) goto LAB_002fe628;
        uVar20 = (ulong)uVar19;
        if (0xf < uVar19) {
          uVar20 = 0x10;
        }
        auVar32 = *(undefined1 (*) [16])(left + iVar21);
        if (upsample_left == 0) {
          auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
          uVar4 = (ushort)(uVar23 >> 1);
          uVar78 = uVar4 & 0x1f;
          auVar93._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar93._8_2_ = uVar78;
          auVar93._10_2_ = uVar78;
          auVar93._12_2_ = uVar78;
          auVar93._14_2_ = uVar78;
          auVar93._16_2_ = uVar78;
          auVar93._18_2_ = uVar78;
          auVar93._20_2_ = uVar78;
          auVar93._22_2_ = uVar78;
          auVar93._24_2_ = uVar78;
          auVar93._26_2_ = uVar78;
          auVar93._28_2_ = uVar78;
          auVar93._30_2_ = uVar78;
        }
        else {
          auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
          auVar76 = vpsrldq_avx(auVar32,8);
          auVar92._0_2_ = (undefined2)uVar23;
          auVar92._2_2_ = auVar92._0_2_;
          auVar92._4_2_ = auVar92._0_2_;
          auVar92._6_2_ = auVar92._0_2_;
          auVar92._8_2_ = auVar92._0_2_;
          auVar92._10_2_ = auVar92._0_2_;
          auVar92._12_2_ = auVar92._0_2_;
          auVar92._14_2_ = auVar92._0_2_;
          auVar92._16_2_ = auVar92._0_2_;
          auVar92._18_2_ = auVar92._0_2_;
          auVar92._20_2_ = auVar92._0_2_;
          auVar92._22_2_ = auVar92._0_2_;
          auVar92._24_2_ = auVar92._0_2_;
          auVar92._26_2_ = auVar92._0_2_;
          auVar92._28_2_ = auVar92._0_2_;
          auVar92._30_2_ = auVar92._0_2_;
          auVar80 = vpsllw_avx2(auVar92,ZEXT416((uint)upsample_left));
          auVar80 = vpsrlw_avx2(auVar80,1);
          auVar93 = vpand_avx2(auVar80,auVar68);
        }
        auVar80 = vpmovzxbw_avx2(auVar32);
        auVar71 = vpmovzxbw_avx2(auVar76);
        auVar71 = vpsubw_avx2(auVar71,auVar80);
        auVar71 = vpmullw_avx2(auVar71,auVar93);
        auVar80 = vpsllw_avx2(auVar80,5);
        auVar80 = vpaddw_avx2(auVar80,auVar49);
        auVar80 = vpaddw_avx2(auVar71,auVar80);
        auVar80 = vpsrlw_avx2(auVar80,5);
        auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
        auVar32 = vpblendvb_avx(auVar30,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
        *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
        uVar23 = uVar23 + dy;
      }
      goto LAB_002fe631;
    }
    if (bw == 0x20) {
      uVar1 = left[0x3f];
      auVar29[1] = uVar1;
      auVar29[0] = uVar1;
      auVar29[2] = uVar1;
      auVar29[3] = uVar1;
      auVar29[4] = uVar1;
      auVar29[5] = uVar1;
      auVar29[6] = uVar1;
      auVar29[7] = uVar1;
      auVar29[8] = uVar1;
      auVar29[9] = uVar1;
      auVar29[10] = uVar1;
      auVar29[0xb] = uVar1;
      auVar29[0xc] = uVar1;
      auVar29[0xd] = uVar1;
      auVar29[0xe] = uVar1;
      auVar29[0xf] = uVar1;
      auVar37[0x10] = uVar1;
      auVar37._0_16_ = auVar29;
      auVar37[0x11] = uVar1;
      auVar37[0x12] = uVar1;
      auVar37[0x13] = uVar1;
      auVar37[0x14] = uVar1;
      auVar37[0x15] = uVar1;
      auVar37[0x16] = uVar1;
      auVar37[0x17] = uVar1;
      auVar37[0x18] = uVar1;
      auVar37[0x19] = uVar1;
      auVar37[0x1a] = uVar1;
      auVar37[0x1b] = uVar1;
      auVar37[0x1c] = uVar1;
      auVar37[0x1d] = uVar1;
      auVar37[0x1e] = uVar1;
      auVar37[0x1f] = uVar1;
      lVar16 = 0;
      auVar48._8_2_ = 0x10;
      auVar48._0_8_ = 0x10001000100010;
      auVar48._10_2_ = 0x10;
      auVar48._12_2_ = 0x10;
      auVar48._14_2_ = 0x10;
      auVar48._16_2_ = 0x10;
      auVar48._18_2_ = 0x10;
      auVar48._20_2_ = 0x10;
      auVar48._22_2_ = 0x10;
      auVar48._24_2_ = 0x10;
      auVar48._26_2_ = 0x10;
      auVar48._28_2_ = 0x10;
      auVar48._30_2_ = 0x10;
      lVar17 = 0;
      uVar23 = dy;
      do {
        if (lVar17 == 0x20) break;
        iVar18 = (int)uVar23 >> 6;
        lVar22 = lVar16;
        if (iVar18 < 0x3f) {
          uVar19 = -(iVar18 + -0x3f);
          uVar4 = (ushort)(uVar23 >> 1);
          uVar78 = uVar4 & 0x1f;
          auVar58._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar58._8_2_ = uVar78;
          auVar58._10_2_ = uVar78;
          auVar58._12_2_ = uVar78;
          auVar58._14_2_ = uVar78;
          auVar58._16_2_ = uVar78;
          auVar58._18_2_ = uVar78;
          auVar58._20_2_ = uVar78;
          auVar58._22_2_ = uVar78;
          auVar58._24_2_ = uVar78;
          auVar58._26_2_ = uVar78;
          auVar58._28_2_ = uVar78;
          auVar58._30_2_ = uVar78;
          for (lVar22 = 0; lVar22 != 0x20; lVar22 = lVar22 + 0x10) {
            auVar80 = auVar37;
            if (lVar22 < (int)uVar19) {
              auVar80 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar22 + iVar18));
              auVar71 = vpmovzxbw_avx2(*(undefined1 (*) [16])(left + lVar22 + (long)iVar18 + 1));
              auVar71 = vpsubw_avx2(auVar71,auVar80);
              auVar71 = vpmullw_avx2(auVar71,auVar58);
              auVar80 = vpsllw_avx2(auVar80,5);
              auVar80 = vpaddw_avx2(auVar80,auVar48);
              auVar80 = vpaddw_avx2(auVar71,auVar80);
              auVar80 = vpsrlw_avx2(auVar80,5);
              auVar67._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar80._16_16_;
              auVar67._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar29
              ;
              auVar80 = vpackuswb_avx2(auVar80,auVar67);
            }
            *(undefined1 (*) [32])((long)local_1460 + lVar22 * 2) = auVar80;
          }
          if (0x1f < uVar19) {
            uVar19 = 0x20;
          }
          auVar7._16_8_ = alStack_1450[0];
          auVar7._24_8_ = alStack_1450[1];
          auVar7._0_8_ = local_1460[0];
          auVar7._8_8_ = local_1460[1];
          auVar10._16_8_ = alStack_1430[0];
          auVar10._24_8_ = alStack_1430[1];
          auVar10._0_8_ = local_1440[0];
          auVar10._8_8_ = local_1440[1];
          auVar80 = vperm2i128_avx2(auVar7,auVar10,0x20);
          auVar80 = vpblendvb_avx2(auVar37,auVar80,
                                   *(undefined1 (*) [32])(BaseMask[0] + (uVar19 << 5)));
          *(undefined1 (*) [32])(local_1060 + lVar17 * 4) = auVar80;
          uVar23 = uVar23 + dy;
        }
        else {
          for (; lVar22 != 0x400; lVar22 = lVar22 + 0x20) {
            *(undefined1 (*) [32])((long)local_1060 + lVar22) = auVar37;
          }
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x20;
      } while (iVar18 < 0x3f);
      transpose16x32_avx2((__m256i *)local_1060,(__m256i *)local_1460);
      transpose16x32_avx2((__m256i *)(local_f60 + 0x20),(__m256i *)alStack_1260);
      puVar13 = dst + 0x10;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x20) {
        uVar2 = *(undefined8 *)((long)local_1460 + lVar16 + 8);
        *(undefined8 *)(puVar13 + -0x10) = *(undefined8 *)((long)local_1460 + lVar16);
        *(undefined8 *)(puVar13 + -8) = uVar2;
        uVar2 = *(undefined8 *)((long)alStack_1260 + lVar16 + 8);
        *(undefined8 *)puVar13 = *(undefined8 *)((long)alStack_1260 + lVar16);
        *(undefined8 *)(puVar13 + 8) = uVar2;
        puVar13 = puVar13 + stride;
      }
      puVar13 = dst + stride * 0x10 + 0x10;
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x20) {
        uVar2 = *(undefined8 *)((long)alStack_1450 + lVar16 + 8);
        *(undefined8 *)puVar13 = *(undefined8 *)((long)alStack_1450 + lVar16);
        *(undefined8 *)(puVar13 + 8) = uVar2;
        uVar2 = *(undefined8 *)((long)alStack_1260 + lVar16 + 0x18);
        *(undefined8 *)(puVar13 + 0x10) = *(undefined8 *)((long)alStack_1260 + lVar16 + 0x10);
        *(undefined8 *)(puVar13 + 0x18) = uVar2;
        puVar13 = puVar13 + stride;
      }
      return;
    }
    if (bw != 4) {
      return;
    }
    iVar18 = 7 << (bVar15 & 0x1f);
    uVar1 = left[iVar18];
    auVar24[1] = uVar1;
    auVar24[0] = uVar1;
    auVar24[2] = uVar1;
    auVar24[3] = uVar1;
    auVar24[4] = uVar1;
    auVar24[5] = uVar1;
    auVar24[6] = uVar1;
    auVar24[7] = uVar1;
    auVar24[8] = uVar1;
    auVar24[9] = uVar1;
    auVar24[10] = uVar1;
    auVar24[0xb] = uVar1;
    auVar24[0xc] = uVar1;
    auVar24[0xd] = uVar1;
    auVar24[0xe] = uVar1;
    auVar24[0xf] = uVar1;
    auVar42._8_2_ = 0x10;
    auVar42._0_8_ = 0x10001000100010;
    auVar42._10_2_ = 0x10;
    auVar42._12_2_ = 0x10;
    auVar42._14_2_ = 0x10;
    auVar42._16_2_ = 0x10;
    auVar42._18_2_ = 0x10;
    auVar42._20_2_ = 0x10;
    auVar42._22_2_ = 0x10;
    auVar42._24_2_ = 0x10;
    auVar42._26_2_ = 0x10;
    auVar42._28_2_ = 0x10;
    auVar42._30_2_ = 0x10;
    auVar61._8_2_ = 0x1f;
    auVar61._0_8_ = 0x1f001f001f001f;
    auVar61._10_2_ = 0x1f;
    auVar61._12_2_ = 0x1f;
    auVar61._14_2_ = 0x1f;
    auVar61._16_2_ = 0x1f;
    auVar61._18_2_ = 0x1f;
    auVar61._20_2_ = 0x1f;
    auVar61._22_2_ = 0x1f;
    auVar61._24_2_ = 0x1f;
    auVar61._26_2_ = 0x1f;
    auVar61._28_2_ = 0x1f;
    auVar61._30_2_ = 0x1f;
    uVar23 = dy;
    for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
      iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
      uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
      if ((int)uVar19 < 1) goto LAB_002fd98d;
      uVar20 = (ulong)uVar19;
      if (3 < uVar19) {
        uVar20 = 4;
      }
      auVar32 = *(undefined1 (*) [16])(left + iVar21);
      if (upsample_left == 0) {
        auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
        uVar4 = (ushort)(uVar23 >> 1);
        uVar78 = uVar4 & 0x1f;
        auVar81._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
        auVar81._8_2_ = uVar78;
        auVar81._10_2_ = uVar78;
        auVar81._12_2_ = uVar78;
        auVar81._14_2_ = uVar78;
        auVar81._16_2_ = uVar78;
        auVar81._18_2_ = uVar78;
        auVar81._20_2_ = uVar78;
        auVar81._22_2_ = uVar78;
        auVar81._24_2_ = uVar78;
        auVar81._26_2_ = uVar78;
        auVar81._28_2_ = uVar78;
        auVar81._30_2_ = uVar78;
      }
      else {
        auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
        auVar76 = vpsrldq_avx(auVar32,8);
        auVar79._0_2_ = (undefined2)uVar23;
        auVar79._2_2_ = auVar79._0_2_;
        auVar79._4_2_ = auVar79._0_2_;
        auVar79._6_2_ = auVar79._0_2_;
        auVar79._8_2_ = auVar79._0_2_;
        auVar79._10_2_ = auVar79._0_2_;
        auVar79._12_2_ = auVar79._0_2_;
        auVar79._14_2_ = auVar79._0_2_;
        auVar79._16_2_ = auVar79._0_2_;
        auVar79._18_2_ = auVar79._0_2_;
        auVar79._20_2_ = auVar79._0_2_;
        auVar79._22_2_ = auVar79._0_2_;
        auVar79._24_2_ = auVar79._0_2_;
        auVar79._26_2_ = auVar79._0_2_;
        auVar79._28_2_ = auVar79._0_2_;
        auVar79._30_2_ = auVar79._0_2_;
        auVar80 = vpsllw_avx2(auVar79,ZEXT416((uint)upsample_left));
        auVar80 = vpsrlw_avx2(auVar80,1);
        auVar81 = vpand_avx2(auVar80,auVar61);
      }
      auVar80 = vpmovzxbw_avx2(auVar32);
      auVar71 = vpmovzxbw_avx2(auVar76);
      auVar71 = vpsubw_avx2(auVar71,auVar80);
      auVar71 = vpmullw_avx2(auVar71,auVar81);
      auVar80 = vpsllw_avx2(auVar80,5);
      auVar80 = vpaddw_avx2(auVar80,auVar42);
      auVar80 = vpaddw_avx2(auVar71,auVar80);
      auVar80 = vpsrlw_avx2(auVar80,5);
      auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
      auVar32 = vpblendvb_avx(auVar24,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
      *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
      uVar23 = uVar23 + dy;
    }
    goto LAB_002fd993;
  }
  iVar18 = 0xf << (bVar15 & 0x1f);
  uVar1 = left[iVar18];
  auVar28[1] = uVar1;
  auVar28[0] = uVar1;
  auVar28[2] = uVar1;
  auVar28[3] = uVar1;
  auVar28[4] = uVar1;
  auVar28[5] = uVar1;
  auVar28[6] = uVar1;
  auVar28[7] = uVar1;
  auVar28[8] = uVar1;
  auVar28[9] = uVar1;
  auVar28[10] = uVar1;
  auVar28[0xb] = uVar1;
  auVar28[0xc] = uVar1;
  auVar28[0xd] = uVar1;
  auVar28[0xe] = uVar1;
  auVar28[0xf] = uVar1;
  auVar47._8_2_ = 0x10;
  auVar47._0_8_ = 0x10001000100010;
  auVar47._10_2_ = 0x10;
  auVar47._12_2_ = 0x10;
  auVar47._14_2_ = 0x10;
  auVar47._16_2_ = 0x10;
  auVar47._18_2_ = 0x10;
  auVar47._20_2_ = 0x10;
  auVar47._22_2_ = 0x10;
  auVar47._24_2_ = 0x10;
  auVar47._26_2_ = 0x10;
  auVar47._28_2_ = 0x10;
  auVar47._30_2_ = 0x10;
  auVar66._8_2_ = 0x1f;
  auVar66._0_8_ = 0x1f001f001f001f;
  auVar66._10_2_ = 0x1f;
  auVar66._12_2_ = 0x1f;
  auVar66._14_2_ = 0x1f;
  auVar66._16_2_ = 0x1f;
  auVar66._18_2_ = 0x1f;
  auVar66._20_2_ = 0x1f;
  auVar66._22_2_ = 0x1f;
  auVar66._24_2_ = 0x1f;
  auVar66._26_2_ = 0x1f;
  auVar66._28_2_ = 0x1f;
  auVar66._30_2_ = 0x1f;
  uVar23 = dy;
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    iVar21 = (int)uVar23 >> (6 - bVar15 & 0x1f);
    uVar19 = iVar18 - iVar21 >> (bVar15 & 0x1f);
    if ((int)uVar19 < 1) goto LAB_002fe293;
    uVar20 = (ulong)uVar19;
    if (7 < uVar19) {
      uVar20 = 8;
    }
    auVar32 = *(undefined1 (*) [16])(left + iVar21);
    if (upsample_left == 0) {
      auVar76 = *(undefined1 (*) [16])(left + (long)iVar21 + 1);
      uVar4 = (ushort)(uVar23 >> 1);
      uVar78 = uVar4 & 0x1f;
      auVar91._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
      auVar91._8_2_ = uVar78;
      auVar91._10_2_ = uVar78;
      auVar91._12_2_ = uVar78;
      auVar91._14_2_ = uVar78;
      auVar91._16_2_ = uVar78;
      auVar91._18_2_ = uVar78;
      auVar91._20_2_ = uVar78;
      auVar91._22_2_ = uVar78;
      auVar91._24_2_ = uVar78;
      auVar91._26_2_ = uVar78;
      auVar91._28_2_ = uVar78;
      auVar91._30_2_ = uVar78;
    }
    else {
      auVar32 = vpshufb_avx(auVar32,_DAT_0046de30);
      auVar76 = vpsrldq_avx(auVar32,8);
      auVar90._0_2_ = (undefined2)uVar23;
      auVar90._2_2_ = auVar90._0_2_;
      auVar90._4_2_ = auVar90._0_2_;
      auVar90._6_2_ = auVar90._0_2_;
      auVar90._8_2_ = auVar90._0_2_;
      auVar90._10_2_ = auVar90._0_2_;
      auVar90._12_2_ = auVar90._0_2_;
      auVar90._14_2_ = auVar90._0_2_;
      auVar90._16_2_ = auVar90._0_2_;
      auVar90._18_2_ = auVar90._0_2_;
      auVar90._20_2_ = auVar90._0_2_;
      auVar90._22_2_ = auVar90._0_2_;
      auVar90._24_2_ = auVar90._0_2_;
      auVar90._26_2_ = auVar90._0_2_;
      auVar90._28_2_ = auVar90._0_2_;
      auVar90._30_2_ = auVar90._0_2_;
      auVar80 = vpsllw_avx2(auVar90,ZEXT416((uint)upsample_left));
      auVar80 = vpsrlw_avx2(auVar80,1);
      auVar91 = vpand_avx2(auVar80,auVar66);
    }
    auVar80 = vpmovzxbw_avx2(auVar32);
    auVar71 = vpmovzxbw_avx2(auVar76);
    auVar71 = vpsubw_avx2(auVar71,auVar80);
    auVar71 = vpmullw_avx2(auVar71,auVar91);
    auVar80 = vpsllw_avx2(auVar80,5);
    auVar80 = vpaddw_avx2(auVar80,auVar47);
    auVar80 = vpaddw_avx2(auVar71,auVar80);
    auVar80 = vpsrlw_avx2(auVar80,5);
    auVar32 = vpackuswb_avx(auVar80._0_16_,auVar80._16_16_);
    auVar32 = vpblendvb_avx(auVar28,auVar32,*(undefined1 (*) [16])BaseMask[uVar20]);
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
    uVar23 = uVar23 + dy;
  }
  goto LAB_002fe29c;
LAB_002fdd1a:
  for (; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar26;
  }
LAB_002fdd23:
  auVar32 = vpunpcklbw_avx((undefined1  [16])local_1060,(undefined1  [16])local_1050);
  auVar76 = vpunpcklbw_avx((undefined1  [16])local_1040,(undefined1  [16])local_1030);
  auVar77 = vpunpcklbw_avx((undefined1  [16])local_1020,(undefined1  [16])local_1010);
  auVar34 = vpunpcklbw_avx((undefined1  [16])local_1000,(undefined1  [16])local_ff0);
  auVar32 = vpunpcklwd_avx(auVar32,auVar76);
  auVar76 = vpunpcklwd_avx(auVar77,auVar34);
  auVar77 = vpunpckldq_avx(auVar32,auVar76);
  *(long *)dst = auVar77._0_8_;
  uVar2 = vpextrq_avx(auVar77,1);
  *(undefined8 *)(dst + stride) = uVar2;
  auVar32 = vpunpckhdq_avx(auVar32,auVar76);
  *(long *)(dst + stride * 2) = auVar32._0_8_;
  lVar16 = stride * 3;
  goto LAB_002fe340;
LAB_002fe8fd:
  for (; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar76;
  }
LAB_002fe906:
  transpose16x8_8x16_sse2
            (&local_1060,&local_1050,&local_1040,&local_1030,&local_1020,&local_1010,&local_1000,
             &local_ff0,&local_fe0,&local_fd0,&local_fc0,&local_fb0,&local_fa0,&local_f90,&local_f80
             ,&local_f70,&local_1460,&alStack_1450,&local_1440,&alStack_1430,&local_1420,&local_1410
             ,&local_1400,&local_13f0);
  transpose16x8_8x16_sse2
            ((__m128i *)local_f60,(__m128i *)(local_f60 + 2),(__m128i *)(local_f60 + 4),
             (__m128i *)(local_f60 + 6),(__m128i *)(local_f60 + 8),(__m128i *)(local_f60 + 10),
             (__m128i *)(local_f60 + 0xc),(__m128i *)(local_f60 + 0xe),(__m128i *)(local_f60 + 0x10)
             ,(__m128i *)(local_f60 + 0x12),(__m128i *)(local_f60 + 0x14),
             (__m128i *)(local_f60 + 0x16),(__m128i *)(local_f60 + 0x18),
             (__m128i *)(local_f60 + 0x1a),(__m128i *)(local_f60 + 0x1c),
             (__m128i *)(local_f60 + 0x1e),(__m128i *)alStack_13e0,(__m128i *)(alStack_13e0 + 2),
             (__m128i *)(alStack_13e0 + 4),(__m128i *)(alStack_13e0 + 6),
             (__m128i *)(alStack_13e0 + 8),(__m128i *)(alStack_13e0 + 10),
             (__m128i *)(alStack_13e0 + 0xc),(__m128i *)(alStack_13e0 + 0xe));
  puVar13 = dst + 0x10;
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    uVar2 = *(undefined8 *)((long)local_1460 + lVar16 + 8);
    *(undefined8 *)(puVar13 + -0x10) = *(undefined8 *)((long)local_1460 + lVar16);
    *(undefined8 *)(puVar13 + -8) = uVar2;
    uVar2 = *(undefined8 *)((long)alStack_13e0 + lVar16 + 8);
    *(undefined8 *)puVar13 = *(undefined8 *)((long)alStack_13e0 + lVar16);
    *(undefined8 *)(puVar13 + 8) = uVar2;
    puVar13 = puVar13 + stride;
  }
  return;
LAB_002fece3:
  for (; lVar16 != 0x400; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar32;
  }
LAB_002fecec:
  for (uVar20 = 0; uVar20 < 0x40; uVar20 = uVar20 + 0x10) {
    transpose16x16_sse2((__m128i *)(local_1060 + uVar20 * 2),&local_1460);
    pauVar14 = (undefined1 (*) [16])dst;
    for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
      *pauVar14 = *(undefined1 (*) [16])((long)local_1460 + lVar16);
      pauVar14 = (undefined1 (*) [16])(*pauVar14 + stride);
    }
    dst = (uint8_t *)((long)dst + 0x10);
  }
  return;
LAB_002ff0c5:
  for (; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar34;
  }
LAB_002ff0ce:
  for (uVar20 = 0; uVar20 < 0x20; uVar20 = uVar20 + 0x10) {
    transpose16x16_sse2((__m128i *)(local_1060 + uVar20 * 2),&local_1460);
    pauVar14 = (undefined1 (*) [16])dst;
    for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
      *pauVar14 = *(undefined1 (*) [16])((long)local_1460 + lVar16);
      pauVar14 = (undefined1 (*) [16])(*pauVar14 + stride);
    }
    dst = (uint8_t *)((long)dst + 0x10);
  }
  return;
LAB_002ff4a3:
  for (; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar36;
  }
LAB_002ff4ac:
  transpose16x8_8x16_sse2
            (&local_1060,&local_1050,&local_1040,&local_1030,&local_1020,&local_1010,&local_1000,
             &local_ff0,&local_fe0,&local_fd0,&local_fc0,&local_fb0,&local_fa0,&local_f90,&local_f80
             ,&local_f70,&local_1460,&alStack_1450,&local_1440,&alStack_1430,&local_1420,&local_1410
             ,&local_1400,&local_13f0);
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    uVar2 = *(undefined8 *)((long)local_1460 + lVar16 + 8);
    *(undefined8 *)dst = *(undefined8 *)((long)local_1460 + lVar16);
    *(undefined8 *)(dst + 8) = uVar2;
    dst = dst + stride;
  }
  return;
LAB_002ff247:
  for (; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar35;
  }
LAB_002ff250:
  auVar33 = vpunpcklbw_avx((undefined1  [16])local_1060,(undefined1  [16])local_1050);
  auVar35 = vpunpcklbw_avx((undefined1  [16])local_1040,(undefined1  [16])local_1030);
  auVar25 = vpunpcklbw_avx((undefined1  [16])local_1020,(undefined1  [16])local_1010);
  auVar31 = vpunpcklbw_avx((undefined1  [16])local_1000,(undefined1  [16])local_ff0);
  auVar32 = vpunpckhbw_avx((undefined1  [16])local_1060,(undefined1  [16])local_1050);
  auVar76 = vpunpckhbw_avx((undefined1  [16])local_1040,(undefined1  [16])local_1030);
  auVar77 = vpunpckhbw_avx((undefined1  [16])local_1020,(undefined1  [16])local_1010);
  auVar34 = vpunpckhbw_avx((undefined1  [16])local_1000,(undefined1  [16])local_ff0);
  auVar36 = vpunpcklwd_avx(auVar33,auVar35);
  auVar26 = vpunpcklwd_avx(auVar25,auVar31);
  auVar27 = vpunpcklwd_avx(auVar32,auVar76);
  auVar28 = vpunpcklwd_avx(auVar77,auVar34);
  auVar30 = vpunpckldq_avx(auVar36,auVar26);
  auVar36 = vpunpckhdq_avx(auVar36,auVar26);
  auVar29 = vpunpckldq_avx(auVar27,auVar28);
  auVar26 = vpunpckhdq_avx(auVar27,auVar28);
  alVar41 = (__m128i)vpunpcklqdq_avx(auVar30,auVar29);
  local_1460[0] = alVar41[0];
  local_1460[1] = alVar41[1];
  alVar41 = (__m128i)vpunpckhqdq_avx(auVar30,auVar29);
  alStack_1450[0] = alVar41[0];
  alStack_1450[1] = alVar41[1];
  alVar41 = (__m128i)vpunpcklqdq_avx(auVar36,auVar26);
  local_1440[0] = alVar41[0];
  local_1440[1] = alVar41[1];
  alVar41 = (__m128i)vpunpckhqdq_avx(auVar36,auVar26);
  alStack_1430[0] = alVar41[0];
  alStack_1430[1] = alVar41[1];
  auVar36 = vpunpckhwd_avx(auVar33,auVar35);
  auVar26 = vpunpckhwd_avx(auVar25,auVar31);
  auVar32 = vpunpckhwd_avx(auVar32,auVar76);
  auVar76 = vpunpckhwd_avx(auVar77,auVar34);
  auVar34 = vpunpckldq_avx(auVar36,auVar26);
  auVar77 = vpunpckhdq_avx(auVar36,auVar26);
  auVar36 = vpunpckldq_avx(auVar32,auVar76);
  auVar32 = vpunpckhdq_avx(auVar32,auVar76);
  alVar41 = (__m128i)vpunpcklqdq_avx(auVar34,auVar36);
  local_1420[0] = alVar41[0];
  local_1420[1] = alVar41[1];
  alVar41 = (__m128i)vpunpckhqdq_avx(auVar34,auVar36);
  local_1410[0] = alVar41[0];
  local_1410[1] = alVar41[1];
  alVar41 = (__m128i)vpunpcklqdq_avx(auVar77,auVar32);
  local_1400[0] = alVar41[0];
  local_1400[1] = alVar41[1];
  alVar41 = (__m128i)vpunpckhqdq_avx(auVar77,auVar32);
  local_13f0[0] = alVar41[0];
  local_13f0[1] = alVar41[1];
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    *(undefined8 *)dst = *(undefined8 *)((long)local_1460 + lVar16);
    *(undefined8 *)(dst + stride * 8) = *(undefined8 *)((long)local_1460 + lVar16 + 8);
    dst = dst + stride;
  }
  return;
LAB_002fdb24:
  for (; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1460 + lVar16) = auVar25;
  }
LAB_002fdb2a:
  auVar32 = vpunpcklbw_avx((undefined1  [16])local_1460,(undefined1  [16])alStack_1450);
  auVar76 = vpunpcklbw_avx((undefined1  [16])local_1440,(undefined1  [16])alStack_1430);
  alVar40 = (__m128i)vpunpcklwd_avx(auVar32,auVar76);
  alVar41 = (__m128i)vpunpckhwd_avx(auVar32,auVar76);
  local_1060[0] = alVar40[0];
  local_1060[1] = alVar40[1];
  alVar57 = (__m128i)vpsrldq_avx((undefined1  [16])alVar40,4);
  local_1050[0] = alVar57[0];
  local_1050[1] = alVar57[1];
  alVar57 = (__m128i)vpsrldq_avx((undefined1  [16])alVar40,8);
  local_1040[0] = alVar57[0];
  local_1040[1] = alVar57[1];
  alVar40 = (__m128i)vpsrldq_avx((undefined1  [16])alVar40,0xc);
  local_1030[0] = alVar40[0];
  local_1030[1] = alVar40[1];
  local_1020[0] = alVar41[0];
  local_1020[1] = alVar41[1];
  alVar40 = (__m128i)vpsrldq_avx((undefined1  [16])alVar41,4);
  local_1010[0] = alVar40[0];
  local_1010[1] = alVar40[1];
  alVar40 = (__m128i)vpsrldq_avx((undefined1  [16])alVar41,8);
  local_1000[0] = alVar40[0];
  local_1000[1] = alVar40[1];
  alVar41 = (__m128i)vpsrldq_avx((undefined1  [16])alVar41,0xc);
  local_ff0[0] = alVar41[0];
  local_ff0[1] = alVar41[1];
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    *(undefined4 *)dst = *(undefined4 *)((long)local_1060 + lVar16);
    dst = dst + stride;
  }
  return;
LAB_002fdec7:
  for (; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1460 + lVar16) = auVar27;
  }
LAB_002fdecd:
  auVar77 = vpunpcklbw_avx((undefined1  [16])local_1460,(undefined1  [16])alStack_1450);
  auVar34 = vpunpcklbw_avx((undefined1  [16])local_1440,(undefined1  [16])alStack_1430);
  auVar32 = vpunpckhbw_avx((undefined1  [16])local_1460,(undefined1  [16])alStack_1450);
  auVar76 = vpunpckhbw_avx((undefined1  [16])local_1440,(undefined1  [16])alStack_1430);
  auVar36 = vpunpcklwd_avx(auVar77,auVar34);
  auVar26 = vpunpcklwd_avx(auVar32,auVar76);
  auVar77 = vpunpckhwd_avx(auVar77,auVar34);
  auVar32 = vpunpckhwd_avx(auVar32,auVar76);
  auVar34 = vpunpckldq_avx(auVar36,auVar26);
  auVar33 = vpunpckldq_avx(auVar77,auVar32);
  auVar76 = vpunpckhdq_avx(auVar36,auVar26);
  auVar32 = vpunpckhdq_avx(auVar77,auVar32);
  alVar57 = (__m128i)vpunpcklqdq_avx(auVar34,auVar33);
  local_1060[0] = alVar57[0];
  local_1060[1] = alVar57[1];
  alVar41 = (__m128i)vpunpckhqdq_avx(auVar34,auVar33);
  local_1050[0] = alVar41[0];
  local_1050[1] = alVar41[1];
  alVar3 = (__m128i)vpunpcklqdq_avx(auVar76,auVar32);
  local_1040[0] = alVar3[0];
  local_1040[1] = alVar3[1];
  alVar40 = (__m128i)vpunpckhqdq_avx(auVar76,auVar32);
  local_1030[0] = alVar40[0];
  local_1030[1] = alVar40[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar57,8);
  local_1020[0] = alVar56[0];
  local_1020[1] = alVar56[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar41,8);
  local_1010[0] = alVar56[0];
  local_1010[1] = alVar56[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar3,8);
  local_1000[0] = alVar56[0];
  local_1000[1] = alVar56[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar40,8);
  local_ff0[0] = alVar56[0];
  local_ff0[1] = alVar56[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar57,4);
  local_fe0[0] = alVar56[0];
  local_fe0[1] = alVar56[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar41,4);
  local_fd0[0] = alVar56[0];
  local_fd0[1] = alVar56[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar3,4);
  local_fc0[0] = alVar56[0];
  local_fc0[1] = alVar56[1];
  alVar56 = (__m128i)vpsrldq_avx((undefined1  [16])alVar40,4);
  local_fb0[0] = alVar56[0];
  local_fb0[1] = alVar56[1];
  alVar57 = (__m128i)vpsrldq_avx((undefined1  [16])alVar57,0xc);
  local_fa0[0] = alVar57[0];
  local_fa0[1] = alVar57[1];
  alVar41 = (__m128i)vpsrldq_avx((undefined1  [16])alVar41,0xc);
  local_f90[0] = alVar41[0];
  local_f90[1] = alVar41[1];
  alVar41 = (__m128i)vpsrldq_avx((undefined1  [16])alVar3,0xc);
  local_f80[0] = alVar41[0];
  local_f80[1] = alVar41[1];
  alVar41 = (__m128i)vpsrldq_avx((undefined1  [16])alVar40,0xc);
  local_f70[0] = alVar41[0];
  local_f70[1] = alVar41[1];
  for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
    *(undefined4 *)dst = *(undefined4 *)((long)local_1060 + lVar16);
    dst = dst + stride;
  }
  return;
LAB_002fe628:
  for (; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar30;
  }
LAB_002fe631:
  transpose16x16_sse2(&local_1060,&local_1460);
  for (lVar16 = 0; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
    uVar2 = *(undefined8 *)((long)local_1460 + lVar16 + 8);
    *(undefined8 *)dst = *(undefined8 *)((long)local_1460 + lVar16);
    *(undefined8 *)(dst + 8) = uVar2;
    dst = dst + stride;
  }
  return;
LAB_002fe14c:
  for (; lVar16 != 0x100; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar77;
  }
LAB_002fe155:
  for (lVar16 = 0x40; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1460 + lVar16) = (undefined1  [16])0x0;
  }
  transpose16x8_8x16_sse2
            (&local_1060,&local_1050,&local_1040,&local_1030,&local_1020,&local_1010,&local_1000,
             &local_ff0,&local_fe0,&local_fd0,&local_fc0,&local_fb0,&local_fa0,&local_f90,&local_f80
             ,&local_f70,&local_1460,&alStack_1450,&local_1440,&alStack_1430,&local_1420,&local_1410
             ,&local_1400,&local_13f0);
  for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
    uVar2 = *(undefined8 *)((long)local_1460 + lVar16 + 8);
    *(undefined8 *)dst = *(undefined8 *)((long)local_1460 + lVar16);
    *(undefined8 *)(dst + 8) = uVar2;
    dst = dst + stride;
  }
  return;
LAB_002fd98d:
  for (; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar24;
  }
LAB_002fd993:
  auVar32 = vpunpcklbw_avx((undefined1  [16])local_1060,(undefined1  [16])local_1050);
  auVar76 = vpunpcklbw_avx((undefined1  [16])local_1040,(undefined1  [16])local_1030);
  auVar32 = vpunpcklwd_avx(auVar32,auVar76);
  *(int *)dst = auVar32._0_4_;
  *(int *)(dst + stride) = auVar32._4_4_;
  *(int *)(dst + stride * 2) = auVar32._8_4_;
  *(int *)(dst + stride * 3) = auVar32._12_4_;
  return;
LAB_002fe293:
  for (; lVar16 != 0x80; lVar16 = lVar16 + 0x10) {
    *(undefined1 (*) [16])((long)local_1060 + lVar16) = auVar28;
  }
LAB_002fe29c:
  auVar32 = vpunpcklbw_avx((undefined1  [16])local_1060,(undefined1  [16])local_1050);
  auVar77 = vpunpcklbw_avx((undefined1  [16])local_1040,(undefined1  [16])local_1030);
  auVar34 = vpunpcklbw_avx((undefined1  [16])local_1020,(undefined1  [16])local_1010);
  auVar36 = vpunpcklbw_avx((undefined1  [16])local_1000,(undefined1  [16])local_ff0);
  auVar76 = vpunpcklwd_avx(auVar32,auVar77);
  auVar26 = vpunpcklwd_avx(auVar34,auVar36);
  auVar33 = vpunpckldq_avx(auVar76,auVar26);
  *(long *)dst = auVar33._0_8_;
  uVar2 = vpextrq_avx(auVar33,1);
  *(undefined8 *)(dst + stride) = uVar2;
  auVar76 = vpunpckhdq_avx(auVar76,auVar26);
  auVar32 = vpunpckhwd_avx(auVar32,auVar77);
  *(long *)(dst + stride * 2) = auVar76._0_8_;
  uVar2 = vpextrq_avx(auVar76,1);
  *(undefined8 *)(dst + stride * 3) = uVar2;
  auVar76 = vpunpckhwd_avx(auVar34,auVar36);
  auVar77 = vpunpckldq_avx(auVar32,auVar76);
  *(long *)(dst + stride * 4) = auVar77._0_8_;
  uVar2 = vpextrq_avx(auVar77,1);
  *(undefined8 *)(dst + stride * 5) = uVar2;
  auVar32 = vpunpckhdq_avx(auVar32,auVar76);
  *(long *)(dst + stride * 6) = auVar32._0_8_;
  lVar16 = stride * 7;
LAB_002fe340:
  uVar2 = vpextrq_avx(auVar32,1);
  *(undefined8 *)(dst + lVar16) = uVar2;
  return;
}

Assistant:

void av1_dr_prediction_z3_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left, dy);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left, dy);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}